

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_encoder.hpp
# Opt level: O0

bool __thiscall
andyzip::deflate_encoder::encode
          (deflate_encoder *this,uint8_t *dest,uint8_t *dest_max,uint8_t *src,uint8_t *src_max)

{
  uint8_t uVar1;
  unsigned_long uVar2;
  value_type vVar3;
  FILE *__stream;
  unsigned_long *puVar4;
  unsigned_long local_d8;
  unsigned_long local_d0;
  size_t j;
  size_t k;
  char buf [12];
  ulong local_a8;
  size_t addr;
  size_t i;
  suffix_array<unsigned_char,_unsigned_int,_std::allocator> sa;
  size_t size;
  FILE *log;
  size_t block_size;
  uint8_t *src_max_local;
  uint8_t *src_local;
  uint8_t *dest_max_local;
  uint8_t *dest_local;
  deflate_encoder *this_local;
  
  log = (FILE *)0x10000;
  block_size = (size_t)src_max;
  src_max_local = src;
  src_local = dest_max;
  dest_max_local = dest;
  dest_local = (uint8_t *)this;
  __stream = fopen("1.txt","wb");
  if (src_max_local != (uint8_t *)block_size) {
    sa.addr_to_sa_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(block_size - (long)src_max_local);
    puVar4 = std::min<unsigned_long>
                       ((unsigned_long *)
                        &sa.addr_to_sa_.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(unsigned_long *)&log);
    uVar2 = *puVar4;
    suffix_array<unsigned_char,_unsigned_int,_std::allocator>::suffix_array
              ((suffix_array<unsigned_char,_unsigned_int,_std::allocator> *)&i,src_max_local,
               src_max_local + uVar2);
    for (addr = 0; addr != uVar2; addr = addr + 1) {
      vVar3 = suffix_array<unsigned_char,_unsigned_int,_std::allocator>::addr
                        ((suffix_array<unsigned_char,_unsigned_int,_std::allocator> *)&i,addr);
      local_a8 = (ulong)vVar3;
      j = 0;
      local_d8 = 1;
      puVar4 = std::max<unsigned_long>(&local_d8,&local_a8);
      for (local_d0 = *puVar4 - 1; j != 10 && local_d0 != uVar2; local_d0 = local_d0 + 1) {
        if ((src_max_local[local_d0] < 0x20) || (0x7e < src_max_local[local_d0])) {
          uVar1 = '.';
        }
        else {
          uVar1 = src_max_local[local_d0];
        }
        buf[j - 8] = uVar1;
        j = j + 1;
      }
      buf[j - 8] = '\0';
      fprintf(__stream,"%8d <%s>\n",addr,&k);
    }
    suffix_array<unsigned_char,_unsigned_int,_std::allocator>::~suffix_array
              ((suffix_array<unsigned_char,_unsigned_int,_std::allocator> *)&i);
  }
  return false;
}

Assistant:

bool encode(uint8_t *dest, uint8_t *dest_max, const uint8_t *src, const uint8_t *src_max) const {
      size_t block_size = 0x10000;
      FILE *log = fopen("1.txt", "wb");

      while (src != src_max) {
        size_t size = std::min((size_t)(src_max - src), block_size);
        suffix_array<uint8_t, uint32_t> sa(src, src + size);
        for (size_t i = 0; i != size; ++i) {
          size_t addr = sa.addr(i);
          char buf[12];
          size_t k = 0;
          for (size_t j = std::max((size_t)1u, addr)-1; k != 10 && j != size; ++j) {
            buf[k++] = src[j] < ' ' || src[j] >= 0x7f  ? '.' : src[j];
          }
          buf[k] = 0;
          fprintf(log, "%8d <%s>\n", i, buf);
        }
        break;
        src += size;
      }
      return false;
    }